

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall Hospital::Last_Name_Validate(Hospital *this,string *Last_Name)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  ulong uVar4;
  bool bVar5;
  string Last_Name_1;
  byte *local_40;
  ulong local_38;
  long local_30 [2];
  
  pcVar1 = (Last_Name->_M_dataplus)._M_p;
  local_40 = (byte *)local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + Last_Name->_M_string_length);
  bVar5 = local_38 == 0;
  if (!bVar5) {
    if ((byte)((*local_40 & 0xdf) + 0xbf) < 0x1a) {
      uVar4 = 0;
      do {
        if (local_38 - 1 == uVar4) {
          bVar5 = true;
          goto LAB_0011c033;
        }
        lVar2 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((byte)((local_40[lVar2] & 0xdf) + 0xbf) < 0x1a);
      bVar5 = local_38 <= uVar4;
    }
    else {
      bVar5 = false;
    }
  }
LAB_0011c033:
  if (local_40 != (byte *)local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Your Last_Name must consist of numbers character !",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return false;
  }
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar3 = psVar3 + 0x10;
  pcVar1 = (Last_Name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>(psVar3,pcVar1,pcVar1 + Last_Name->_M_string_length);
  __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool Hospital :: Last_Name_Validate(string Last_Name){
    try {
        if(!validate_String_Must_Be_character(Last_Name)) {
            cout <<"Your Last_Name must consist of numbers character !"<<endl;
            return false;
        }
        else throw Last_Name;
    }
    catch(string Last_Name) {
        cout << "your Last_Name entered successfully ."<<endl;
        return true;
    }
}